

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  code *pcVar1;
  GLuint GVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_t sVar8;
  reference pvVar9;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  int local_214;
  GLchar *pGStack_210;
  GLint i_2;
  undefined1 local_208 [8];
  MessageBuilder message;
  int local_80;
  GLint i_1;
  GLint index_sum;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> compatible_subroutines;
  GLuint i;
  GLint name_length;
  GLint uniform;
  GLuint n_details;
  inspectionDetails details [3];
  GLint n_active_subroutine_uniforms;
  bool result;
  Functions *gl;
  GLchar **uniform_names_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  details[2].expected_value._3_1_ = 1;
  details[2].pname = 0;
  uniform = 0x8e4a;
  n_details = this->m_n_active_subroutines;
  details[0].pname = 0x8a38;
  details[0].expected_value = this->m_n_active_subroutine_uniform_size;
  details[1].pname = 0x8a39;
  details[1].expected_value = 0;
  name_length = 3;
  (**(code **)(lVar7 + 0x9d0))(program_id,0x8b31,0x8de6,details + 2);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xd7f);
  for (i = 0; (int)i < (int)details[2].pname; i = i + 1) {
    sVar8 = strlen(uniform_names[(int)i]);
    compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar8;
    details[1].expected_value =
         compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    for (compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < 3;
        compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) {
      bVar3 = checkActiveSubroutineUniformiv
                        (this,program_id,i,
                         (&uniform)
                         [(ulong)(uint)compatible_subroutines.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage * 2],
                         details[(ulong)(uint)compatible_subroutines.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage - 1].
                         expected_value);
      if (!bVar3) {
        details[2].expected_value._3_1_ = 0;
      }
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_70);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_70,(long)this->m_n_active_subroutines);
    GVar2 = i;
    local_80 = 0;
    pcVar1 = *(code **)(lVar7 + 0x748);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,0);
    (*pcVar1)(program_id,0x8b31,GVar2,0x8e4b,pvVar9);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"getActiveSubroutineUniformiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xd98);
    for (message.m_str._372_4_ = 0; (int)message.m_str._372_4_ < this->m_n_active_subroutines;
        message.m_str._372_4_ = message.m_str._372_4_ + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_70,
                          (long)(int)message.m_str._372_4_);
      local_80 = *pvVar9 + local_80;
    }
    if (((this->m_n_active_subroutines + -1) * this->m_n_active_subroutines) / 2 != local_80) {
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_208,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_208,
                           (char (*) [71])
                           "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: ")
      ;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&i);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])". pname: ");
      pGStack_210 = Utils::pnameToStr(0x8e4b);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&stack0xfffffffffffffdf0);
      tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])". Results: ");
      for (local_214 = 1; local_214 < this->m_n_active_subroutines; local_214 = local_214 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_70,(long)local_214);
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_208,pvVar9);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
      details[2].expected_value._3_1_ = 0;
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_208);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  }
  return (bool)(details[2].expected_value._3_1_ & 1);
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformiv(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;

	inspectionDetails details[] = {
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_UNIFORM_SIZE, m_n_active_subroutine_uniform_size },
		{ GL_UNIFORM_NAME_LENGTH, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	/* Get amount of active subroutine uniforms */
	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLint name_length = (GLint)strlen(uniform_names[uniform]);

		details[2].expected_value = name_length + 1;

		/* Checks from "details" */
		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false ==
				checkActiveSubroutineUniformiv(program_id, uniform, details[i].pname, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		std::vector<GLint> compatible_subroutines;
		compatible_subroutines.resize(m_n_active_subroutines);
		GLint index_sum = 0;

		gl.getActiveSubroutineUniformiv(program_id, GL_VERTEX_SHADER, uniform, GL_COMPATIBLE_SUBROUTINES,
										&compatible_subroutines[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformiv");

		/* Expected indices are 0, 1, 2, ... N */
		for (GLint i = 0; i < m_n_active_subroutines; ++i)
		{
			index_sum += compatible_subroutines[i];
		}

		/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
		if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
		{
			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: " << uniform
					<< ". pname: " << Utils::pnameToStr(GL_COMPATIBLE_SUBROUTINES) << ". Results: ";

			for (GLint i = 1; i < m_n_active_subroutines; ++i)
			{
				message << compatible_subroutines[i];
			}

			message << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}